

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_benchmark.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_c1df::read_iostream_prealloc
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          char *file_name)

{
  size_type __n;
  uchar *puVar1;
  undefined1 auVar2 [16];
  allocator<unsigned_char> local_252;
  undefined1 local_251;
  fpos<__mbstate_t> local_250;
  undefined8 local_240;
  pos_type file_size;
  long local_220;
  ifstream file;
  char *file_name_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *output;
  
  std::ifstream::ifstream(&local_220);
  std::ios::exceptions((int)&local_220 + (int)*(undefined8 *)(local_220 + -0x18));
  std::ifstream::open((char *)&local_220,(_Ios_Openmode)file_name);
  std::istream::seekg((long)&local_220,_S_beg);
  auVar2 = std::istream::tellg();
  file_size._M_off = auVar2._8_8_;
  local_240 = auVar2._0_8_;
  std::fpos<__mbstate_t>::fpos(&local_250,0);
  std::istream::seekg(&local_220,local_250._M_off,local_250._M_state);
  local_251 = 0;
  __n = std::fpos::operator_cast_to_long((fpos *)&local_240);
  std::allocator<unsigned_char>::allocator(&local_252);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,__n,&local_252);
  std::allocator<unsigned_char>::~allocator(&local_252);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(__return_storage_ptr__);
  std::fpos::operator_cast_to_long((fpos *)&local_240);
  std::istream::read((char *)&local_220,(long)puVar1);
  local_251 = 1;
  std::ifstream::~ifstream(&local_220);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::uint8_t> read_iostream_prealloc(const char* file_name)
{
    std::ifstream file{};
    file.exceptions(std::ios::badbit);
    file.open(file_name, std::ios_base::binary);

    file.seekg(0, std::ios_base::end);
    auto file_size = file.tellg();
    file.seekg(0);
    std::vector<std::uint8_t> output(file_size);

    file.read(reinterpret_cast<char*>(output.data()), file_size);

    return output;
}